

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void appendAllPathElements(DbPath *pPath,char *zPath)

{
  char *__src;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  long lVar5;
  char *pcVar6;
  undefined8 uVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  long in_FS_OFFSET;
  stat buf;
  undefined1 local_10d8 [24];
  uint local_10c0;
  char local_1048 [4112];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar10 = 0;
  do {
    __src = zPath + iVar10;
    for (lVar9 = 0; (__src[lVar9] != '\0' && (__src[lVar9] != '/')); lVar9 = lVar9 + 1) {
    }
    uVar1 = (uint)lVar9;
    if (iVar10 < (int)(iVar10 + uVar1)) {
      if (zPath[iVar10] == '.') {
        if (uVar1 != 1) {
          uVar2 = pPath->nUsed;
          if ((uVar1 != 2) || (__src[1] != '.')) goto LAB_00128a49;
          if (1 < (int)uVar2) {
            pcVar6 = pPath->zOut + uVar2;
            do {
              uVar2 = uVar2 - 1;
              pcVar6 = pcVar6 + -1;
              pPath->nUsed = uVar2;
            } while (*pcVar6 != '/');
            goto LAB_00128b2e;
          }
          goto LAB_00128b27;
        }
      }
      else {
        uVar2 = pPath->nUsed;
LAB_00128a49:
        if ((int)(uVar2 + uVar1 + 2) < pPath->nOut) {
          pPath->nUsed = uVar2 + 1;
          pPath->zOut[(int)uVar2] = '/';
          memcpy(pPath->zOut + pPath->nUsed,__src,(long)(int)uVar1);
          iVar3 = pPath->nUsed + uVar1;
          pPath->nUsed = iVar3;
          if (pPath->rc == 0) {
            pPath->zOut[iVar3] = '\0';
            pcVar6 = pPath->zOut;
            iVar3 = (*aSyscall[0x1b].pCurrent)(pcVar6,local_10d8);
            if (iVar3 == 0) {
              if ((local_10c0 & 0xf000) == 0xa000) {
                iVar3 = pPath->nSymlink;
                pPath->nSymlink = iVar3 + 1;
                if (200 < iVar3) {
                  sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xa3ef,
                              "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
                  goto LAB_00128b8e;
                }
                lVar5 = (*aSyscall[0x1a].pCurrent)(pcVar6,local_1048,0x1000);
                if (lVar5 - 0x1000U < 0xfffffffffffff001) {
                  sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xa3f4,
                              "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
                  puVar4 = (uint *)__errno_location();
                  uVar2 = *puVar4;
                  if (pcVar6 == (char *)0x0) {
                    pcVar6 = "";
                  }
                  uVar7 = 0xa3f4;
                  pcVar8 = "readlink";
                  goto LAB_00128b1e;
                }
                local_1048[lVar5] = '\0';
                iVar3 = 0;
                if (local_1048[0] != '/') {
                  iVar3 = ~uVar1 + pPath->nUsed;
                }
                pPath->nUsed = iVar3;
                appendAllPathElements(pPath,local_1048);
              }
            }
            else {
              puVar4 = (uint *)__errno_location();
              if (*puVar4 != 2) {
                sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xa3e9,
                            "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
                uVar2 = *puVar4;
                if (pcVar6 == (char *)0x0) {
                  pcVar6 = "";
                }
                uVar7 = 0xa3e9;
                pcVar8 = "lstat";
LAB_00128b1e:
                sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",uVar7,(ulong)uVar2,pcVar8,pcVar6,""
                           );
LAB_00128b8e:
                pPath->rc = 0xe;
              }
            }
          }
        }
        else {
LAB_00128b27:
          pPath->rc = 1;
        }
      }
    }
LAB_00128b2e:
    iVar10 = iVar10 + uVar1 + 1;
    if (__src[lVar9] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

static void appendAllPathElements(
  DbPath *pPath,       /* Path under construction, to which to append zName */
  const char *zPath    /* Path to append to pPath.  Is zero-terminated */
){
  int i = 0;
  int j = 0;
  do{
    while( zPath[i] && zPath[i]!='/' ){ i++; }
    if( i>j ){
      appendOnePathElement(pPath, &zPath[j], i-j);
    }
    j = i+1;
  }while( zPath[i++] );
}